

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O3

void __thiscall slang::DiagnosticEngine::setDefaultWarnings(DiagnosticEngine *this)

{
  DiagCode *pDVar1;
  DiagGroup *pDVar2;
  DiagCode *pDVar3;
  undefined1 in_stack_00000038 [16];
  
  this->ignoreAllWarnings = true;
  pDVar2 = findDefaultDiagGroup((string_view)in_stack_00000038);
  pDVar1 = (pDVar2->diags).super__Vector_base<slang::DiagCode,_std::allocator<slang::DiagCode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pDVar3 = (pDVar2->diags).
                super__Vector_base<slang::DiagCode,_std::allocator<slang::DiagCode>_>._M_impl.
                super__Vector_impl_data._M_start; pDVar3 != pDVar1; pDVar3 = pDVar3 + 1) {
    setSeverity(this,*pDVar3,Warning);
  }
  return;
}

Assistant:

void DiagnosticEngine::setDefaultWarnings() {
    setIgnoreAllWarnings(true);
    setSeverity(*findDiagGroup("default"sv), DiagnosticSeverity::Warning);
}